

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_true(int a,char *testcase,int line)

{
  uint uVar1;
  uint in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  int err;
  
  test_counter = test_counter + 1;
  uVar1 = (uint)((in_EDI != 0 ^ 0xffU) & 1);
  if (uVar1 == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_RSI);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_RSI);
    printf("# Failure on line %d\n",(ulong)in_EDX);
    global_err = global_err + 1;
  }
  return uVar1;
}

Assistant:

int assert_true(int a, const char *testcase, int line)
{
    test_counter++;
    int err = !a;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Failure on line %d\n", line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}